

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<const_char_(&)[14],_QString>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<const_char_(&)[14],_QString> *this)

{
  QChar *pQVar1;
  long lVar2;
  char16_t *__src;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  iterator d;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->b).d.size + 0xd;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar3,Uninitialized);
  pQVar1 = (QChar *)(__return_storage_ptr__->d).ptr;
  QVar4.m_data = *this->a;
  QVar4.m_size = 0xd;
  local_38 = pQVar1;
  QAbstractConcatenable::convertFromUtf8(QVar4,&local_38);
  lVar2 = (this->b).d.size;
  if (lVar2 != 0) {
    __src = (this->b).d.ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(local_38,__src,lVar2 * 2);
  }
  local_38 = local_38 + lVar2;
  if (lVar3 != (long)local_38 - (long)pQVar1 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }